

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

bool __thiscall Dashel::SocketStream::receiveDataAndCheckDisconnection(SocketStream *this)

{
  _func_int *p_Var1;
  size_t sVar2;
  int *piVar3;
  
  if ((this->super_DisconnectableStream).recvBufferPos !=
      (this->super_DisconnectableStream).recvBufferSize) {
    __assert_fail("recvBufferPos == recvBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x22c,"virtual bool Dashel::SocketStream::receiveDataAndCheckDisconnection()");
  }
  sVar2 = recv((this->super_DisconnectableStream).super_SelectableStream.fd,
               &(this->super_DisconnectableStream).super_SelectableStream.field_0x10,0x1000,0);
  if ((long)sVar2 < 1) {
    if ((long)sVar2 < 0) {
      p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-3];
      piVar3 = __errno_location();
      Stream::fail((Stream *)
                   ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream + (long)p_Var1),IOError,*piVar3,
                   "Socket read I/O error.");
    }
  }
  else {
    (this->super_DisconnectableStream).recvBufferSize = sVar2;
    (this->super_DisconnectableStream).recvBufferPos = 0;
  }
  return (long)sVar2 < 1;
}

Assistant:

virtual bool receiveDataAndCheckDisconnection()
		{
			assert(recvBufferPos == recvBufferSize);

			ssize_t len = recv(fd, &recvBuffer, RECV_BUFFER_SIZE, 0);
			if (len > 0)
			{
				recvBufferSize = len;
				recvBufferPos = 0;
				return false;
			}
			else
			{
				if (len < 0)
					fail(DashelException::IOError, errno, "Socket read I/O error.");
				return true;
			}
		}